

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secant.c
# Opt level: O2

int bfgs_min2(custom_function *funcpt,custom_gradient *funcgrad,double *xi,int N,int m,double *dx,
             double fsval,double maxstep,int MAXITER,int *niter,double eps,double gtol,double ftol,
             double xtol,double *xf)

{
  size_t __size;
  double dVar1;
  int iVar2;
  double *f;
  double *xi_00;
  double *__ptr;
  ulong uVar3;
  undefined4 in_register_0000000c;
  ulong uVar4;
  double *pdVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar6;
  int N_00;
  double local_f0;
  double alpha;
  double *local_e0;
  undefined1 local_d8 [16];
  double local_c0;
  double *local_b8;
  custom_gradient *local_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_90;
  double fxf;
  double local_80;
  double local_78;
  custom_function *local_70;
  double local_68;
  double *local_60;
  double *local_58;
  ulong local_50;
  double local_48;
  double *local_40;
  int local_34;
  
  local_50 = CONCAT44(in_register_0000000c,N);
  __size = (long)N * 8;
  alpha = xtol;
  local_c0 = ftol;
  local_b8 = xi;
  local_b0 = funcgrad;
  local_80 = gtol;
  local_78 = eps;
  local_70 = funcpt;
  local_48 = maxstep;
  local_40 = dx;
  f = (double *)malloc(__size);
  local_58 = (double *)malloc(__size);
  xi_00 = (double *)malloc(__size);
  fxf = (double)malloc(__size);
  local_60 = (double *)malloc((long)N * __size);
  __ptr = (double *)malloc(__size);
  *niter = 0;
  if (local_78 < 0.0) {
    local_68 = sqrt(local_78);
  }
  else {
    local_68 = SQRT(local_78);
  }
  pdVar5 = local_b8;
  local_f0 = 1.0;
  uVar3 = 0;
  uVar4 = 0;
  if (0 < (int)local_50) {
    uVar4 = local_50 & 0xffffffff;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    local_b8[uVar3] = local_40[uVar3] * local_b8[uVar3];
    local_40[uVar3] = 1.0 / local_40[uVar3];
  }
  local_a8 = (*local_70->funcpt)(local_b8,(int)local_50,local_70->params);
  uStack_a0 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
  uVar3 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc) & 0x7fffffffffffffff;
  local_34 = 0;
  local_d8._8_4_ = (int)uVar3;
  local_d8._0_8_ = ABS(local_a8);
  local_d8._12_4_ = (int)(uVar3 >> 0x20);
  if (1.79769313486232e+308 <= ABS(local_a8)) {
    printf("Program Exiting as the function value exceeds the maximum double value");
    local_34 = 0xf;
  }
  if (NAN(local_a8)) {
    printf("Program Exiting as the function returns NaN");
    local_34 = 0xf;
  }
  iVar2 = grad_fd(local_70,local_b0,pdVar5,(int)local_50,local_40,local_68,f);
  if (iVar2 == 0xf) {
    local_34 = 0xf;
  }
  if (local_48 <= 0.0) {
    dVar6 = 0.0;
    local_48 = 0.0;
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      dVar1 = local_40[uVar3];
      dVar6 = dVar6 + dVar1 * dVar1;
      local_48 = local_48 + dVar1 * pdVar5[uVar3] * dVar1 * pdVar5[uVar3];
    }
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    if (local_48 < 0.0) {
      dVar1 = local_48;
      local_48 = dVar6;
      dVar1 = sqrt(dVar1);
    }
    else {
      dVar1 = SQRT(local_48);
      local_48 = dVar6;
    }
    if (local_48 <= dVar1) {
      local_48 = dVar1 * 1000.0;
    }
    else {
      local_48 = local_48 * 1000.0;
    }
  }
  dVar6 = (double)local_d8._0_8_;
  if ((double)local_d8._0_8_ <= ABS(fsval)) {
    dVar6 = ABS(fsval);
  }
  for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    dVar1 = ABS(pdVar5[uVar3]);
    if (ABS(pdVar5[uVar3]) <= 1.0 / ABS(local_40[uVar3])) {
      dVar1 = 1.0 / ABS(local_40[uVar3]);
    }
    local_58[uVar3] = (ABS(f[uVar3]) * dVar1) / dVar6;
  }
  dVar6 = array_max_abs(local_58,(int)local_50);
  if (dVar6 <= local_80 * 0.001) {
    local_34 = 1;
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      xf[uVar3] = pdVar5[uVar3];
    }
  }
  inithess_lower(local_60,(int)local_50,local_a8,fsval,local_40);
  for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    xi_00[uVar3] = pdVar5[uVar3];
  }
  local_90 = local_a8;
  local_e0 = __ptr;
  do {
    if (local_34 != 0) {
LAB_0012bc46:
      for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        pdVar5[uVar3] = local_40[uVar3] * pdVar5[uVar3];
        local_40[uVar3] = 1.0 / local_40[uVar3];
      }
      free(f);
      free(local_58);
      free(xi_00);
      free(local_60);
      free((void *)fxf);
      free(__ptr);
      return local_34;
    }
    if (MAXITER <= *niter) {
      local_34 = 4;
      goto LAB_0012bc46;
    }
    *niter = *niter + 1;
    iVar2 = (int)local_50;
    scale(f,1,iVar2,-1.0);
    linsolve_lower(local_60,iVar2,f,(double *)fxf);
    scale(f,1,iVar2,-1.0);
    pdVar5 = local_40;
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      __ptr[uVar3] = f[uVar3];
    }
    N_00 = (int)local_50;
    iVar2 = lnsrchmt(local_70,local_b0,xi_00,&local_90,f,&local_f0,(double *)fxf,N_00,local_40,
                     local_48,MAXITER,local_68,local_c0,local_80,alpha,xf);
    local_34 = stopcheck2_mt(local_90,N_00,local_a8,f,pdVar5,local_78,local_80,local_c0,iVar2);
    __ptr = local_e0;
    local_a8 = local_90;
    uStack_a0 = 0;
    bfgs_factored(local_60,N_00,local_78,xi_00,xf,local_e0,f);
    for (uVar3 = 0; pdVar5 = local_b8, uVar4 != uVar3; uVar3 = uVar3 + 1) {
      xi_00[uVar3] = xf[uVar3];
    }
  } while( true );
}

Assistant:

int bfgs_min2(custom_function *funcpt, custom_gradient *funcgrad, double *xi, int N, int m, double *dx, double fsval, double maxstep, int MAXITER, int *niter,
	double eps, double gtol, double ftol, double xtol, double *xf)  {
	int rcode, gfdcode;
	int i, siter, retval;
	double dt1, dt2;
	double fx, num, den, stop0, fxf, eps2,fo,alpha;
	double *jac, *hess, *scheck, *xc, *L, *step, *jacf;

	jac = (double*)malloc(sizeof(double)*N);
	scheck = (double*)malloc(sizeof(double)*N);
	xc = (double*)malloc(sizeof(double)*N);
	step = (double*)malloc(sizeof(double)*N);
	hess = (double*)malloc(sizeof(double)*N * N);
	L = (double*)malloc(sizeof(double)*N * N);
	jacf = (double*)malloc(sizeof(double)*N);

	/*
	* Return Codes
	*
	* Codes 1,2,3 denote possible success.
	* Codes 0 and 4 denote failure.
	*
	* 1 - df(x)/dx <= gtol achieved so xf may be the local minima.
	* 2 - Distance between the last two steps is less than stol or |xf - xi| <= stol so xf may be the local minima.
	* 3 - Global Step failed to locate a lower point than xi so xi may be the local minima.
	* 4 - Iteration Limit exceeded. Convergence not achieved.
	* 15 -Failure as Inf/Nan Values encountered
	*
	*/

	rcode = 0;
	*niter = 0;
	siter = MAXITER;
	eps2 = sqrt(eps);

	alpha = 1.0;
	gfdcode = 0;

	//set values
	for (i = 0; i < N; ++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	fx = FUNCPT_EVAL(funcpt, xi, N);
	if (fx >= DBL_MAX || fx <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		rcode = 15;
	}
	if (fx != fx) {
		printf("Program Exiting as the function returns NaN");
		rcode = 15;
	}

	fo = fx;

	gfdcode = grad_fd(funcpt, funcgrad, xi, N, dx, eps2, jac);
	if (gfdcode == 15) {
		rcode = 15;
	}


	//maxstep = 1000.0; // Needs to be set at a much higher value proportional to l2 norm of dx

	if (maxstep <= 0.0) {
		maxstep = 1000.0;
		dt1 = dt2 = 0.0;
		for (i = 0; i < N; ++i) {
			dt1 += dx[i] * dx[i];
			dt2 += dx[i] * xi[i] * dx[i] * xi[i];
		}

		dt1 = sqrt(dt1);
		dt2 = sqrt(dt2);

		if (dt1 > dt2) {
			maxstep *= dt1;
		}
		else {
			maxstep *= dt2;
		}
	}

	//Check Stop0
	if (fabs(fx) > fabs(fsval)) {
		den = fabs(fx);
	}
	else {
		den = fabs(fsval);
	}
	for (i = 0; i < N; ++i) {
		if (fabs(xi[i]) > 1.0 / fabs(dx[i])) {
			num = fabs(xi[i]);
		}
		else {
			num = 1.0 / fabs(dx[i]);
		}
		scheck[i] = fabs(jac[i]) * num / den;
	}

	stop0 = array_max_abs(scheck, N);

	if (stop0 <= gtol * 1e-03) {
		rcode = 1;
		for (i = 0; i < N; ++i) {
			xf[i] = xi[i];
		}
	}

	//hessian_fd(funcpt,xi,N,dx,hess);
	inithess_lower(L, N, fx, fsval, dx);

	for (i = 0; i < N; ++i) {
		xc[i] = xi[i];
	}
	fxf = fx;

	while (rcode == 0 && *niter < siter) {
		*niter = *niter + 1;
		scale(jac, 1, N, -1.0);

		linsolve_lower(L, N, jac, step);

		scale(jac, 1, N, -1.0);

		for (i = 0; i < N; ++i) {
			jacf[i] = jac[i];
		}

		//retval = lnsrch(funcpt, xc, jac, step, N, dx, maxstep, stol, xf);
		retval = lnsrchmt(funcpt,funcgrad, xc, &fxf, jac, &alpha, step, N, dx, maxstep,MAXITER,eps2,ftol, gtol, xtol, xf);

		//rcode = stopcheck(fxf, N, xc, xf, jacf, dx, fsval, gtol, stol, retval);
		rcode = stopcheck2_mt(fxf, N, fo, jac, dx, eps, gtol, ftol, retval);
		fo = fxf;
		//hessian_fd(funcpt,xf,N,dx,hess);
		//bfgs_naive(hess,N,xc,xf,jac,jacf);
		bfgs_factored(L, N, eps, xc, xf, jacf, jac);
		for (i = 0; i < N; ++i) {
			xc[i] = xf[i];
		}
	}

	if (rcode == 0 && *niter >= siter) {
		rcode = 4;
	}

	for (i = 0; i < N; ++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}

	free(jac);
	free(hess);
	free(scheck);
	free(xc);
	free(L);
	free(step);
	free(jacf);
	return rcode;
}